

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_helper.c
# Opt level: O1

void helper_fsave_x86_64(CPUX86State *env,target_ulong ptr,int data32)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  target_ulong ptr_00;
  uintptr_t unaff_retaddr;
  
  do_fstenv(env,ptr,data32,unaff_retaddr);
  ptr_00 = (long)(0xe << ((byte)data32 & 0x1f)) + ptr;
  iVar3 = 0;
  do {
    uVar2 = (ulong)((env->fpstt + iVar3 & 7) << 4);
    uVar1 = *(ushort *)((long)env->fpregs + uVar2 + 8);
    cpu_stq_data_ra_x86_64(env,ptr_00,*(uint64_t *)((long)env->fpregs + uVar2),unaff_retaddr);
    cpu_stw_data_ra_x86_64(env,ptr_00 + 8,(uint)uVar1,unaff_retaddr);
    iVar3 = iVar3 + 1;
    ptr_00 = ptr_00 + 10;
  } while (iVar3 != 8);
  env->fpstt = 0;
  env->fpus = 0;
  env->fpuc = 0x37f;
  env->fpcs = 0;
  env->fpds = 0;
  env->fpip = 0;
  env->fpdp = 0;
  update_fp_status_x86_64(env);
  builtin_memcpy(env->fptags,"\x01\x01\x01\x01\x01\x01\x01\x01",8);
  return;
}

Assistant:

void helper_fsave(CPUX86State *env, target_ulong ptr, int data32)
{
    floatx80 tmp;
    int i;

    do_fstenv(env, ptr, data32, GETPC());

    ptr += (14 << data32);
    for (i = 0; i < 8; i++) {
        tmp = ST(i);
        helper_fstt(env, tmp, ptr, GETPC());
        ptr += 10;
    }

    do_fninit(env);
}